

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O1

int amqp_management_set_override_status_description_key_name
              (AMQP_MANAGEMENT_HANDLE amqp_management,char *override_status_description_key_name)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  
  if (amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0 ||
      override_status_description_key_name == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x568;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = "NULL";
      if (override_status_description_key_name != (char *)0x0) {
        pcVar3 = override_status_description_key_name;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"amqp_management_set_override_status_description_key_name",0x567,1,
                "Bad arguments: amqp_management = %p, override_status_description_key_name = %s",
                amqp_management,pcVar3);
    }
  }
  else {
    iVar1 = internal_set_status_description_key_name
                      (amqp_management,override_status_description_key_name);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x574;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"amqp_management_set_override_status_description_key_name",0x573,1,
                  "Cannot set status description key name");
      }
    }
  }
  return iVar1;
}

Assistant:

int amqp_management_set_override_status_description_key_name(AMQP_MANAGEMENT_HANDLE amqp_management, const char* override_status_description_key_name)
{
    int result;

    /* Codes_SRS_AMQP_MANAGEMENT_01_178: [ If `amqp_management` is NULL, `amqp_management_set_override_status_description_key_name` shall fail and return a non-zero value. ]*/
    if ((amqp_management == NULL) ||
        /* Tests_SRS_AMQP_MANAGEMENT_01_179: [ If `override_status_description_key_name` is NULL, `amqp_management_set_override_status_description_key_name` shall fail and return a non-zero value. ]*/
        (override_status_description_key_name == NULL))
    {
        LogError("Bad arguments: amqp_management = %p, override_status_description_key_name = %s",
            amqp_management, MU_P_OR_NULL(override_status_description_key_name));
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_174: [ `amqp_management_set_override_status_description_key_name` shall set the status description key name used to parse the status description from the reply messages to `over ride_status_description_key_name`.]*/
        /* Codes_SRS_AMQP_MANAGEMENT_01_175: [ `amqp_management_set_override_status_description_key_name` shall copy the `override_status_description_key_name` string. ]*/
        /* Codes_SRS_AMQP_MANAGEMENT_01_176: [ `amqp_management_set_override_status_description_key_name` shall free any string previously used for the status description key name. ]*/
        /* Codes_SRS_AMQP_MANAGEMENT_01_177: [ On success, `amqp_management_set_override_status_description_key_name` shall return 0. ]*/
        if (internal_set_status_description_key_name(amqp_management, override_status_description_key_name) != 0)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_180: [ If any error occurs in copying the `override_status_description_key_name` string, `amqp_management_set_override_status_description_key_name` shall fail and return a non-zero value. ]*/
            LogError("Cannot set status description key name");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}